

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

void __thiscall amrex::BoxArray::define(BoxArray *this,BoxList *bl)

{
  uint uVar1;
  
  clear(this);
  uVar1 = (bl->btype).itype;
  (this->m_bat).m_bat_type = (uint)(uVar1 != 0);
  (this->m_bat).m_op.m_indexType.m_typ.itype = uVar1;
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::_M_move_assign
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
             (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,bl);
  type_update(this);
  return;
}

Assistant:

void
BoxArray::define (BoxList&& bl) noexcept
{
    clear();
    m_bat = BATransformer(bl.ixType());
    m_ref->define(std::move(bl));
    type_update();
}